

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::assign(path *this,string_type *source)

{
  format fmt;
  
  fmt = (format)source;
  std::__cxx11::string::operator=((string *)this,(string *)source);
  postprocess_path_with_format(&this->_path,fmt);
  return this;
}

Assistant:

GHC_INLINE path& path::assign(path::string_type&& source)
{
#ifdef GHC_USE_WCHAR_T
    _path = detail::toUtf8(source);
#else
    _path = std::move(source);
#endif
    postprocess_path_with_format(_path, native_format);
    return *this;
}